

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfTport.c
# Opt level: O0

void sbfTport_destroy(sbfTport tport)

{
  long *plVar1;
  long in_RDI;
  sbfTportDestroyStreamClosure *closure0;
  sbfTportStream tstream;
  long lVar2;
  sbfTport tport_00;
  
  sbfLog_log(*(undefined8 *)(in_RDI + 8),0,"destroying transport %p",in_RDI);
  pthread_mutex_lock((pthread_mutex_t *)(in_RDI + 0x180));
  for (lVar2 = *(long *)(in_RDI + 0x170); lVar2 != 0; lVar2 = *(long *)(lVar2 + 0x50)) {
    plVar1 = (long *)sbfMemory_malloc(0x98);
    *plVar1 = in_RDI;
    plVar1[1] = lVar2;
    plVar1[2] = *(long *)(lVar2 + 8);
    sbfMw_enqueueThread(plVar1[2],plVar1 + 3,sbfTportFirstDestroyStreamCb,plVar1);
    *(int *)(in_RDI + 0x1d8) = *(int *)(in_RDI + 0x1d8) + 1;
  }
  tport_00 = (sbfTport)0x0;
  while (*(int *)(in_RDI + 0x1d8) != 0) {
    sbfLog_log(*(undefined8 *)(in_RDI + 8),0,"transport %p waiting for %u streams",in_RDI,
               *(undefined4 *)(in_RDI + 0x1d8));
    pthread_cond_wait((pthread_cond_t *)(in_RDI + 0x1a8),(pthread_mutex_t *)(in_RDI + 0x180));
  }
  pthread_mutex_unlock((pthread_mutex_t *)(in_RDI + 0x180));
  (**(code **)(*(long *)(in_RDI + 0x20) + 0x10))(*(undefined8 *)(in_RDI + 0x28));
  sbfLog_log(*(undefined8 *)(in_RDI + 8),0,"freeing transport %p",in_RDI);
  sbfTportFree(tport_00);
  return;
}

Assistant:

void
sbfTport_destroy (sbfTport tport)
{
    sbfTportStream                tstream;
    sbfTportDestroyStreamClosure* closure0;

    sbfLog_debug (tport->mLog, "destroying transport %p", tport);

    sbfMutex_lock (&tport->mStreamsLock);
    TAILQ_FOREACH (tstream, &tport->mStreams, mEntry)
    {
        closure0 = xmalloc (sizeof *closure0);
        closure0->mTport = tport;
        closure0->mTportStream = tstream;

        closure0->mThread = tstream->mThread;
        sbfMw_enqueueThread (closure0->mThread,
                             &closure0->mEvent,
                             sbfTportFirstDestroyStreamCb,
                             closure0);

        tport->mStreamsWaiting++;
    }
    while (tport->mStreamsWaiting != 0)
    {
        sbfLog_debug (tport->mLog,
                      "transport %p waiting for %u streams",
                      tport,
                      tport->mStreamsWaiting);
        sbfCondVar_wait (&tport->mStreamsCondVar, &tport->mStreamsLock);
    }
    sbfMutex_unlock (&tport->mStreamsLock);

    tport->mHandlerTable->mDestroy (tport->mHandler);

    sbfLog_debug (tport->mLog, "freeing transport %p", tport);
    sbfTportFree (tport);
}